

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O3

err_t stb99ParamsVal(stb99_params *params)

{
  size_t sVar1;
  bool_t bVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  u64 *dest;
  u64 *dest_00;
  qr_o *r;
  void *stack;
  err_t eVar10;
  ulong m;
  size_t m_00;
  ulong n;
  ulong no;
  ulong count;
  
  bVar2 = memIsValid(params,0x3d0);
  if (bVar2 == 0) {
    eVar10 = 0x6d;
  }
  else {
    sVar5 = params->l;
    lVar4 = 0;
    do {
      if (*(size_t *)((long)_ls + lVar4) == sVar5) {
        sVar1 = *(size_t *)((long)_rs + lVar4);
        if (sVar1 != params->r) {
          return 0x1f6;
        }
        n = sVar5 + 0x3f >> 6;
        no = sVar5 + 7 >> 3;
        m = sVar1 + 0x3f >> 6;
        sVar5 = zmMontCreate_keep(no);
        sVar6 = priIsPrime_deep(n);
        sVar7 = zzDiv_deep(n,m);
        sVar8 = zmMontCreate_deep(no);
        m_00 = (n - m) + 1;
        sVar9 = zmMontCreate_deep(no);
        sVar9 = qrPower_deep(n,m_00,sVar9);
        sVar6 = utilMax(4,sVar6,sVar7,sVar8,sVar9);
        dest = (u64 *)blobCreate(sVar6 + sVar5 + n * 0x18 + 8);
        if (dest != (u64 *)0x0) {
          sVar5 = zmMontCreate_keep(no);
          u64From(dest,params->p,no);
          sVar6 = 0x134 - no;
          bVar2 = memIsZero(params->p + no,sVar6);
          eVar10 = 0x1f6;
          if ((bVar2 != 0) && (sVar7 = wwBitSize(dest,n), sVar7 == params->l)) {
            dest_00 = dest + n;
            r = (qr_o *)(dest_00 + n * 2 + 1);
            stack = (void *)((long)&(r->hdr).keep + sVar5);
            bVar2 = priIsPrime(dest,n,stack);
            if (bVar2 != 0) {
              count = sVar1 + 7 >> 3;
              u64From(dest_00,params->q,count);
              bVar2 = memIsZero(params->q + count,0x21 - count);
              if (((bVar2 != 0) && (sVar5 = wwBitSize(dest_00,m), sVar5 == params->r)) &&
                 (bVar2 = priIsPrime(dest_00,m,stack), bVar2 != 0)) {
                zzSubW2(dest,n,1);
                zzDiv(dest_00 + m,dest,dest,n,dest_00,m,stack);
                bVar2 = wwIsZero(dest,m);
                if (bVar2 != 0) {
                  zmMontCreate(r,params->p,no,params->l + 2,stack);
                  bVar2 = memIsZero(params->d + no,sVar6);
                  if ((bVar2 != 0) &&
                     (iVar3 = (*(code *)dest_00[n * 2 + 9])(dest,params->d,r,stack), iVar3 != 0)) {
                    qrPower(dest,dest,dest_00 + m,m_00,r,stack);
                    bVar2 = wwEq(dest,(word *)dest_00[n * 2 + 5],dest_00[n * 2 + 7]);
                    if (bVar2 == 0) {
                      u64From(dest_00 + n + 1,params->a,no);
                      bVar2 = memIsZero(params->a + no,sVar6);
                      if (bVar2 != 0) {
                        bVar2 = wwEq(dest_00 + n + 1,dest,n);
                        eVar10 = 0x1f6;
                        if (bVar2 != 0) {
                          eVar10 = 0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          blobClose(dest);
          return eVar10;
        }
        return 0x6e;
      }
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x50);
    eVar10 = 0x1f6;
  }
  return eVar10;
}

Assistant:

err_t stb99ParamsVal(const stb99_params* params)
{
	size_t n, no;
	size_t m, mo;
	// состояние 
	void* state;
	word* p;
	word* q;
	word* t;
	word* d;
	word* a;
	qr_o* qr;
	void* stack;
	// проверить указатели
	if (!memIsValid(params, sizeof(stb99_params)))
		return ERR_BAD_INPUT;
	// проверить размерности
	for (n = 0; n < COUNT_OF(_ls); ++n)
		if (_ls[n] == params->l)
			break;
	if (n == COUNT_OF(_ls) || _rs[n] != params->r)
		return ERR_BAD_PARAMS;
	// размерности
	n = W_OF_B(params->l), no = O_OF_B(params->l);
	m = W_OF_B(params->r), mo = O_OF_B(params->r);
	// создать состояние
	state = blobCreate(
		O_OF_W(3 * n + 1) + zmMontCreate_keep(no) +  
		utilMax(4,
			priIsPrime_deep(n),
			zzDiv_deep(n, m),
			zmMontCreate_deep(no),
			qrPower_deep(n, n - m + 1, zmMontCreate_deep(no))));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	p = d = (word*)state;
	q = p + n;
	t = q + m;
	a = t + n - m + 1;
	qr = (qr_o*)(a + n);
	stack = (octet*)qr + zmMontCreate_keep(no);
	// p -- l-битовое простое?
	wwFrom(p, params->p, no);
	if (!memIsZero(params->p + no, sizeof(params->p) - no) ||
		wwBitSize(p, n) != params->l || !priIsPrime(p, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// q -- r-битовое простое?
	wwFrom(q, params->q, mo);
	if (!memIsZero(params->q + mo, sizeof(params->q) - mo) ||
		wwBitSize(q, m) != params->r || !priIsPrime(q, m, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// t <- (p - 1) div q
	zzSubW2(p, n, 1);
	zzDiv(t, p, p, n, q, m, stack);
	// q | p - 1?
	if (!wwIsZero(p, m))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// построить кольцо Монтгомери
	zmMontCreate(qr, params->p, no, params->l + 2, stack);
	// загрузить d
	if (!memIsZero(params->d + no, sizeof(params->d) - no) ||
		!qrFrom(d, params->d, qr, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// d <- d^((p - 1)/q) \neq e?
	qrPower(d, d, t, n - m + 1, qr, stack);
	if (qrIsUnity(d, qr))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// a == params->a?
	wwFrom(a, params->a, no);
	if (!memIsZero(params->a + no, sizeof(params->a) - no) ||
		!wwEq(a, d, n))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// все нормально
	blobClose(state);
	return ERR_OK;
}